

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O3

bool test_Player_getHand(bool verbose)

{
  CardType CVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  pointer pCVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries;
  Hand *this;
  DiceRoller *this_00;
  Player *this_01;
  CardType *i;
  pointer pCVar4;
  char *pcVar5;
  long lVar6;
  pointer pCVar7;
  pointer pCVar8;
  Deck deck;
  Deck DStack_58;
  pointer local_40;
  pointer local_38;
  
  ownedCountries = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (Hand *)operator_new(8);
  Hand::Hand(this);
  Deck::Deck(&DStack_58,3);
  Deck::createDeck(&DStack_58);
  Deck::draw(&DStack_58,this);
  Deck::draw(&DStack_58,this);
  Deck::draw(&DStack_58,this);
  Deck::draw(&DStack_58,this);
  this_00 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_00);
  this_01 = (Player *)operator_new(0x38);
  Player::Player(this_01,ownedCountries,this,this_00,1);
  pvVar2 = this_01->pCards->handPointer;
  pCVar8 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar7 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[35m",5);
    pvVar2 = this_01->pCards->handPointer;
    pCVar3 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_38 = pCVar8;
    local_40 = pCVar7;
    for (pCVar4 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                  super__Vector_impl_data._M_start; pCVar4 != pCVar3; pCVar4 = pCVar4 + 1) {
      CVar1 = *pCVar4;
      if (CVar1 == CAVALRY) {
        lVar6 = 7;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"player1 has a card ",0x13);
        pcVar5 = "CAVALRY";
LAB_0010932c:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
      }
      else {
        if (CVar1 == ARTILLERY) {
          lVar6 = 9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"player1 has a card ",0x13);
          pcVar5 = "ARTILLERY";
          goto LAB_0010932c;
        }
        if (CVar1 == INFANTRY) {
          lVar6 = 8;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"player1 has a card ",0x13);
          pcVar5 = "INFANTRY";
          goto LAB_0010932c;
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
    pCVar7 = local_40;
    pCVar8 = local_38;
  }
  Player::~Player(this_01);
  operator_delete(this_01,0x38);
  Deck::~Deck(&DStack_58);
  return pCVar8 != pCVar7;
}

Assistant:

bool test_Player_getHand(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    auto* cards = new Hand();
    Deck deck = Deck(3);
    deck.createDeck();
    deck.draw(*cards);
    deck.draw(*cards);
    deck.draw(*cards);
    deck.draw(*cards);
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 1);

    // Assert
    if (player1->getCards()->getHand()->empty()) {
        success = false;
    }

    if (verbose) {
        std::cout << "\n" << "\033[35m";
        for (auto& i : *player1->getCards()->getHand()) {
            switch ((int) i) {
                case 0:
                    std::cout << "player1 has a card " << "INFANTRY" << std::endl;
                    break;
                case 1:
                    std::cout << "player1 has a card " << "ARTILLERY" << std::endl;
                    break;
                case 2:
                    std::cout << "player1 has a card " << "CAVALRY" << std::endl;
                    break;
            }
        }
        std::cout << "\033[31m";
    }
    delete player1;
    return success;
}